

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QGles2Buffer::endFullDynamicBufferUpdateForCurrentFrame(QGles2Buffer *this)

{
  long lVar1;
  bool bVar2;
  QOpenGLFunctions *this_00;
  long in_RDI;
  QRhiGles2 *rhiD;
  GLuint in_stack_ffffffffffffffc8;
  UsageFlag in_stack_ffffffffffffffcc;
  QOpenGLFunctions *in_stack_ffffffffffffffd0;
  QByteArray *this_01;
  GLenum in_stack_ffffffffffffffdc;
  GLenum target;
  QOpenGLExtraFunctions *in_stack_ffffffffffffffe0;
  
  bVar2 = QFlags<QRhiBuffer::UsageFlag>::testFlag
                    ((QFlags<QRhiBuffer::UsageFlag> *)in_stack_ffffffffffffffd0,
                     in_stack_ffffffffffffffcc);
  if (!bVar2) {
    lVar1 = *(long *)(in_RDI + 8);
    QOpenGLFunctions::glBindBuffer
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if ((*(uint *)(lVar1 + 0x24c) >> 0x19 & 1) == 0) {
      this_01 = *(QByteArray **)(lVar1 + 400);
      target = *(GLenum *)(in_RDI + 0x44);
      this_00 = (QOpenGLFunctions *)(ulong)*(uint *)(in_RDI + 0x3c);
      QByteArray::data(this_01);
      QOpenGLFunctions::glBufferSubData
                (this_00,target,(qopengl_GLintptr)this_01,
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(void *)0x92c56b);
    }
    else {
      QOpenGLExtraFunctions::glUnmapBuffer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void QGles2Buffer::endFullDynamicBufferUpdateForCurrentFrame()
{
    if (!m_usage.testFlag(UniformBuffer)) {
        QRHI_RES_RHI(QRhiGles2);
        rhiD->f->glBindBuffer(targetForDataOps, buffer);
        if (rhiD->caps.properMapBuffer)
            rhiD->f->glUnmapBuffer(targetForDataOps);
        else
            rhiD->f->glBufferSubData(targetForDataOps, 0, nonZeroSize, data.data());
    }
}